

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_audio.c
# Opt level: O1

void audio_make_sane(int *ndev,int *devvec,int *nchan,int *chanvec,int maxdev)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = *ndev;
  lVar2 = (long)iVar1;
  iVar3 = *nchan;
  lVar4 = (long)iVar3;
  if (lVar2 == -1) {
    if (iVar3 == -1) {
      *nchan = 0;
      iVar3 = 0;
    }
    else {
      lVar2 = 0;
      do {
        devvec[lVar2] = (int)lVar2;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
LAB_00171538:
      iVar3 = *nchan;
    }
  }
  else {
    if (iVar3 == -1) {
      *nchan = iVar1;
      if (0 < *ndev) {
        lVar2 = 0;
        do {
          chanvec[lVar2] = 2;
          lVar2 = lVar2 + 1;
        } while (lVar2 < *ndev);
      }
      goto LAB_0017158f;
    }
    if (iVar3 <= iVar1) {
      if (iVar1 <= iVar3) goto LAB_0017158f;
      if (iVar3 < *ndev) {
        do {
          if (lVar4 == 0) {
            *chanvec = 2;
          }
          else {
            chanvec[lVar4] = chanvec[lVar4 + -1];
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < *ndev);
      }
      goto LAB_00171538;
    }
    iVar3 = *nchan;
    if (iVar1 < iVar3) {
      do {
        if (lVar2 == 0) {
          *devvec = 0;
        }
        else {
          devvec[lVar2] = devvec[lVar2 + -1] + 1;
        }
        lVar2 = lVar2 + 1;
        iVar3 = *nchan;
      } while (lVar2 < iVar3);
    }
  }
  *ndev = iVar3;
LAB_0017158f:
  iVar1 = *ndev;
  if ((long)iVar1 < 4) {
    memset(devvec + iVar1,0xff,(ulong)(3 - iVar1) * 4 + 4);
  }
  iVar1 = *nchan;
  if (3 < (long)iVar1) {
    return;
  }
  memset(chanvec + iVar1,0,(ulong)(3 - iVar1) * 4 + 4);
  return;
}

Assistant:

static void audio_make_sane(int *ndev, int *devvec,
    int *nchan, int *chanvec, int maxdev)
{
    int i;
    if (*ndev == -1)
    {           /* no input audio devices specified */
        if (*nchan == -1)
        {
            if (*ndev >= 1)
            {
                *nchan=1;
                chanvec[0] = SYS_DEFAULTCH;
                *ndev = 1;
                devvec[0] = DEFAULTAUDIODEV;
            }
            else *ndev = *nchan = 0;
        }
        else
        {
            for (i = 0; i < maxdev; i++)
                devvec[i] = i;
            *ndev = *nchan;
        }
    }
    else
    {
        if (*nchan == -1)
        {
            *nchan = *ndev;
            for (i = 0; i < *ndev; i++)
                chanvec[i] = SYS_DEFAULTCH;
        }
        else if (*nchan > *ndev)
        {
            for (i = *ndev; i < *nchan; i++)
            {
                if (i == 0)
                    devvec[0] = DEFAULTAUDIODEV;
                else devvec[i] = devvec[i-1] + 1;
            }
            *ndev = *nchan;
        }
        else if (*nchan < *ndev)
        {
            for (i = *nchan; i < *ndev; i++)
            {
                if (i == 0)
                    chanvec[0] = SYS_DEFAULTCH;
                else chanvec[i] = chanvec[i-1];
            }
            *ndev = *nchan;
        }
    }
    for (i = *ndev; i < maxdev; i++)
        devvec[i] = -1;
    for (i = *nchan; i < maxdev; i++)
        chanvec[i] = 0;

}